

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorsTests.cpp
# Opt level: O2

void __thiscall VectorsTest_FP3SumAssignment_Test::TestBody(VectorsTest_FP3SumAssignment_Test *this)

{
  char *pcVar1;
  AssertHelper local_60;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  double dStack_40;
  double local_38 [2];
  double local_28;
  double dStack_20;
  double local_18;
  
  local_28 = 9.0;
  dStack_20 = -3.0;
  local_18 = 0.0;
  local_48.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4022000000000000
  ;
  dStack_40 = -3.0;
  local_38[0] = 0.0;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"v1.x","FP3(9, -3, 0).x",&local_28,(double *)&local_48);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_48);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/math/VectorsTests.cpp"
               ,0x105,pcVar1);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_48);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    local_48.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         0x4022000000000000;
    dStack_40 = -3.0;
    local_38[0] = 0.0;
    testing::internal::CmpHelperEQ<double,double>
              ((internal *)&gtest_ar,"v1.y","FP3(9, -3, 0).y",&dStack_20,&dStack_40);
    if (gtest_ar.success_ != false) {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      local_48.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           0x4022000000000000;
      dStack_40 = -3.0;
      local_38[0] = 0.0;
      testing::internal::CmpHelperEQ<double,double>
                ((internal *)&gtest_ar,"v1.z","FP3(9, -3, 0).z",&local_18,local_38);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_48);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar1 = "";
        }
        else {
          pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/math/VectorsTests.cpp"
                   ,0x105,pcVar1);
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_48);
        testing::internal::AssertHelper::~AssertHelper(&local_60);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_48);
      }
      goto LAB_00189394;
    }
    testing::Message::Message((Message *)&local_48);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/math/VectorsTests.cpp"
               ,0x105,pcVar1);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_48);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_60);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_48);
LAB_00189394:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(VectorsTest, FP3Truncate)
{
    FP3 v(5.2, 7.5, -1.4);
    ASSERT_EQ_INT3(truncate(v), Int3(5, 7, -1));
}